

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O0

int bssl::dtls1_flush(SSL *ssl)

{
  uint16_t uVar1;
  int iVar2;
  uint *puVar3;
  pointer ctx;
  OPENSSL_timeval now_00;
  OPENSSL_timeval OVar4;
  OPENSSL_timeval now;
  int ret_1;
  int ret;
  SSL *ssl_local;
  
  if ((*(ushort *)ssl->d1 >> 6 & 1) != 0) {
    iVar2 = send_ack(ssl);
    if (iVar2 < 1) {
      return iVar2;
    }
    *(ushort *)ssl->d1 = *(ushort *)ssl->d1 & 0xffbf;
  }
  if ((*(ushort *)ssl->d1 >> 5 & 1) != 0) {
    iVar2 = send_flight(ssl);
    if (iVar2 < 1) {
      return iVar2;
    }
    ssl->d1->outgoing_written = '\0';
    ssl->d1->outgoing_offset = 0;
    *(ushort *)ssl->d1 = *(ushort *)ssl->d1 & 0xffdf;
    iVar2 = SSL_in_init(ssl);
    if ((iVar2 != 0) || (uVar1 = ssl_protocol_version(ssl), 0x303 < uVar1)) {
      if (ssl->d1->num_timeouts == 0) {
        ssl->d1->timeout_duration_ms = ssl->initial_timeout_duration_ms;
      }
      else {
        now._12_4_ = ssl->d1->timeout_duration_ms << 1;
        now.tv_usec = 60000;
        puVar3 = std::min<unsigned_int>((uint *)&now.field_0xc,&now.tv_usec);
        ssl->d1->timeout_duration_ms = *puVar3;
      }
      ctx = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&ssl->ctx);
      OVar4 = ssl_ctx_get_current_time(ctx);
      now.tv_sec._0_4_ = OVar4.tv_usec;
      now_00._12_4_ = 0;
      now_00.tv_sec = SUB128(OVar4._0_12_,0);
      now_00.tv_usec = SUB124(OVar4._0_12_,8);
      DTLSTimer::StartMicroseconds
                (&ssl->d1->retransmit_timer,now_00,(ulong)ssl->d1->timeout_duration_ms * 1000);
    }
  }
  return 1;
}

Assistant:

int dtls1_flush(SSL *ssl) {
  // Send the pending ACK, if any.
  if (ssl->d1->sending_ack) {
    int ret = send_ack(ssl);
    if (ret <= 0) {
      return ret;
    }
    ssl->d1->sending_ack = false;
  }

  // Send the pending flight, if any.
  if (ssl->d1->sending_flight) {
    int ret = send_flight(ssl);
    if (ret <= 0) {
      return ret;
    }

    // Reset state for the next send.
    ssl->d1->outgoing_written = 0;
    ssl->d1->outgoing_offset = 0;
    ssl->d1->sending_flight = false;

    // Schedule the next retransmit timer. In DTLS 1.3, we retransmit all
    // flights until ACKed. In DTLS 1.2, the final Finished flight is never
    // ACKed, so we do not keep the timer running after the handshake.
    if (SSL_in_init(ssl) || ssl_protocol_version(ssl) >= TLS1_3_VERSION) {
      if (ssl->d1->num_timeouts == 0) {
        ssl->d1->timeout_duration_ms = ssl->initial_timeout_duration_ms;
      } else {
        ssl->d1->timeout_duration_ms =
            std::min(ssl->d1->timeout_duration_ms * 2, uint32_t{60000});
      }

      OPENSSL_timeval now = ssl_ctx_get_current_time(ssl->ctx.get());
      ssl->d1->retransmit_timer.StartMicroseconds(
          now, uint64_t{ssl->d1->timeout_duration_ms} * 1000);
    }
  }

  return 1;
}